

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void lua_rawseti(lua_State *L,int idx,int n)

{
  StkId pTVar1;
  GCObject *pGVar2;
  global_State *pgVar3;
  TValue *pTVar4;
  TValue *pTVar5;
  
  pTVar4 = index2adr(L,idx);
  pTVar1 = L->top;
  pTVar5 = luaH_setnum(L,&((pTVar4->value).gc)->h,n);
  pTVar5->value = pTVar1[-1].value;
  pTVar5->tt = pTVar1[-1].tt;
  if ((3 < L->top[-1].tt) && ((((L->top[-1].value.gc)->gch).marked & 3) != 0)) {
    pGVar2 = (pTVar4->value).gc;
    if (((pGVar2->gch).marked & 4) != 0) {
      pgVar3 = L->l_G;
      (pGVar2->gch).marked = (pGVar2->gch).marked & 0xfb;
      (pGVar2->h).gclist = pgVar3->grayagain;
      pgVar3->grayagain = pGVar2;
    }
  }
  L->top = L->top + -1;
  return;
}

Assistant:

static void lua_rawseti(lua_State*L,int idx,int n){
StkId o;
api_checknelems(L,1);
o=index2adr(L,idx);
luai_apicheck(L,ttistable(o));
setobj(L,luaH_setnum(L,hvalue(o),n),L->top-1);
luaC_barriert(L,hvalue(o),L->top-1);
L->top--;
}